

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Formatter::make_positionals_abi_cxx11_(Formatter *this,App *app)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  undefined8 in_R9;
  function<bool_(const_CLI::Option_*)> *in_stack_000000b0;
  App *in_stack_000000b8;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> opts;
  undefined1 *puVar2;
  string *psVar3;
  string *key;
  FormatterBase *in_stack_ffffffffffffff38;
  allocator<char> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *in_stack_ffffffffffffff58;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *in_stack_ffffffffffffff60;
  undefined1 local_88 [32];
  undefined4 local_68;
  string local_50 [2];
  
  key = local_50;
  psVar3 = in_RDI;
  ::std::function<bool(CLI::Option_const*)>::
  function<CLI::Formatter::make_positionals[abi:cxx11](CLI::App_const*)const::_lambda(CLI::Option_const*)_1_,void>
            ((function<bool_(const_CLI::Option_*)> *)in_RSI,(anon_class_1_0_00000001 *)in_RDI);
  App::get_options(in_stack_000000b8,in_stack_000000b0);
  std::function<bool_(const_CLI::Option_*)>::~function
            ((function<bool_(const_CLI::Option_*)> *)0x19b216);
  bVar1 = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::empty
                    ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)in_RSI);
  if (bVar1) {
    ::std::__cxx11::string::string(in_RSI);
  }
  else {
    puVar2 = &stack0xffffffffffffff57;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    FormatterBase::get_label(in_stack_ffffffffffffff38,key);
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    (**(code **)((in_RSI->_M_dataplus)._M_p + 0x18))
              (in_RDI,in_RSI,local_88,1,&stack0xffffffffffffff38,in_R9,puVar2);
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
              ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)in_RSI);
    ::std::__cxx11::string::~string(in_RDI);
    ::std::__cxx11::string::~string(in_RDI);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
  }
  local_68 = 1;
  std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
            ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)in_RSI);
  return psVar3;
}

Assistant:

CLI11_INLINE std::string Formatter::make_positionals(const App *app) const {
    std::vector<const Option *> opts =
        app->get_options([](const Option *opt) { return !opt->get_group().empty() && opt->get_positional(); });

    if(opts.empty())
        return {};

    return make_group(get_label("Positionals"), true, opts);
}